

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void google::protobuf::internal::
     arena_destruct_object<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
               (void *object)

{
  void *object_local;
  
  InternalMetadata::Container<google::protobuf::UnknownFieldSet>::~Container
            ((Container<google::protobuf::UnknownFieldSet> *)object);
  return;
}

Assistant:

void arena_destruct_object(void* object) {
  reinterpret_cast<T*>(object)->~T();
}